

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::SetReadData(AmpIO *this,quadlet_t *buf)

{
  uint uVar1;
  quadlet_t qVar2;
  uint uVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  
  uVar3 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])();
  for (uVar4 = 0; uVar3 >> 2 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = buf[uVar4];
    this->ReadBuffer[uVar4] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (uVar3 = 0; uVar3 < this->NumEncoders; uVar3 = uVar3 + 1) {
    SetEncoderVelocityData(this,uVar3);
  }
  qVar2 = this->ReadBuffer[0];
  (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])(this);
  (this->super_FpgaIO).firmwareTime =
       extraout_XMM0_Qa * (double)(qVar2 + 1) + (this->super_FpgaIO).firmwareTime;
  return;
}

Assistant:

void AmpIO::SetReadData(const quadlet_t *buf)
{
    unsigned int numQuads = GetReadNumBytes() / sizeof(quadlet_t);
    unsigned int i;
    for (i = 0; i < numQuads; i++) {
        ReadBuffer[i] = bswap_32(buf[i]);
    }
    for (i = 0; i < NumEncoders; i++) {
        SetEncoderVelocityData(i);
    }
    // Add 1 to timestamp because block read clears counter, rather than incrementing
    firmwareTime += (GetTimestamp()+1)*GetFPGAClockPeriod();
}